

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_parse_fd(ly_ctx *ctx,int fd,LYS_INFORMAT format,lys_module **module)

{
  ly_in *local_38;
  ly_in *in;
  lys_module **pplStack_28;
  LY_ERR ret;
  lys_module **module_local;
  LYS_INFORMAT format_local;
  int fd_local;
  ly_ctx *ctx_local;
  
  local_38 = (ly_in *)0x0;
  pplStack_28 = module;
  module_local._0_4_ = format;
  module_local._4_4_ = fd;
  _format_local = ctx;
  if ((uint)fd < 0x80000000) {
    if (format == LYS_IN_UNKNOWN) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","format != LYS_IN_UNKNOWN",
             "lys_parse_fd");
      ctx_local._4_4_ = LY_EINVAL;
    }
    else {
      in._4_4_ = ly_in_new_fd(fd,&local_38);
      if (in._4_4_ == LY_SUCCESS) {
        in._4_4_ = lys_parse(_format_local,local_38,(LYS_INFORMAT)module_local,(char **)0x0,
                             pplStack_28);
        ly_in_free(local_38,'\0');
        ctx_local._4_4_ = in._4_4_;
      }
      else {
        ly_log(_format_local,LY_LLERR,in._4_4_,"Unable to create input handler.");
        ctx_local._4_4_ = in._4_4_;
      }
    }
  }
  else {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","fd > -1","lys_parse_fd");
    ctx_local._4_4_ = LY_EINVAL;
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse_fd(struct ly_ctx *ctx, int fd, LYS_INFORMAT format, struct lys_module **module)
{
    LY_ERR ret;
    struct ly_in *in = NULL;

    LY_CHECK_ARG_RET(ctx, fd > -1, format != LYS_IN_UNKNOWN, LY_EINVAL);

    LY_CHECK_ERR_RET(ret = ly_in_new_fd(fd, &in), LOGERR(ctx, ret, "Unable to create input handler."), ret);

    ret = lys_parse(ctx, in, format, NULL, module);
    ly_in_free(in, 0);

    return ret;
}